

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void compileval(vector<unsigned_int> *code,int wordtype,char *word,int wordlen)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  uint local_3c;
  char *local_38;
  char *p;
  int local_28;
  int local_24;
  int start;
  int wordlen_local;
  char *word_local;
  vector<unsigned_int> *pvStack_10;
  int wordtype_local;
  vector<unsigned_int> *code_local;
  
  local_24 = wordlen;
  _start = word;
  word_local._4_4_ = wordtype;
  pvStack_10 = code;
  switch(wordtype) {
  case 1:
    compileint(code,word);
    break;
  case 2:
    compilefloat(code,word);
    break;
  case 3:
    compilestr(code,word,wordlen,true);
    break;
  case 4:
    compilestr(code,word,wordlen,false);
    break;
  case 5:
    local_28 = vector<unsigned_int>::length(code);
    p._4_4_ = 9;
    vector<unsigned_int>::add(pvStack_10,(uint *)((long)&p + 4));
    p._0_4_ = (local_28 + 2) * 0x100 | 1;
    vector<unsigned_int>::add(pvStack_10,(uint *)&p);
    local_38 = _start;
    compilestatements(pvStack_10,&local_38,4,0);
    local_3c = 0xc4;
    vector<unsigned_int>::add(pvStack_10,&local_3c);
    iVar1 = vector<unsigned_int>::length(pvStack_10);
    iVar3 = local_28 + 1;
    puVar2 = vector<unsigned_int>::operator[](pvStack_10,local_28);
    *puVar2 = (iVar1 - iVar3) * 0x100 | *puVar2;
    break;
  default:
    break;
  case 7:
    compileident(code,word);
  }
  return;
}

Assistant:

static inline void compileval(vector<uint> &code, int wordtype, char *word, int wordlen)
{
    switch(wordtype)
    {
        case VAL_STR: compilestr(code, word, wordlen, true); break;
        case VAL_ANY: compilestr(code, word, wordlen); break;
        case VAL_FLOAT: compilefloat(code, word); break;
        case VAL_INT: compileint(code, word); break;
        case VAL_CODE:
        {
            int start = code.length();
            code.add(CODE_BLOCK);
            code.add(CODE_OFFSET|((start+2)<<8));
            const char *p = word;
            compilestatements(code, p, VAL_ANY);
            code.add(CODE_EXIT|RET_STR);
            code[start] |= uint(code.length() - (start + 1))<<8;
            break;
        }
        case VAL_IDENT: compileident(code, word); break;
        default:
            break;
    }
}